

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

void ncnn::convolution_transform_kernel_packed_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,int kernel_w,
               int kernel_h,int elempack,int out_elempack)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  float *k00;
  int j;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat weight_data_r2;
  int maxk;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  int _c;
  undefined8 in_stack_fffffffffffffcd8;
  Mat *in_stack_fffffffffffffce0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined4 local_270;
  long local_268;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  Mat *in_stack_fffffffffffffdb8;
  undefined4 *local_240;
  int local_238;
  void *local_228;
  int *local_220;
  long local_218;
  long *local_208;
  int local_1fc;
  int local_1f8;
  long local_1e8;
  int local_1dc;
  int local_1d0;
  int local_1cc;
  long *local_1c8;
  undefined8 *local_1b8;
  undefined8 *local_1a8;
  void **local_1a0;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  undefined8 *local_168;
  undefined8 *local_148;
  int local_13c;
  undefined8 *local_138;
  undefined1 local_12d;
  int local_12c;
  void **local_128;
  undefined8 *local_120;
  undefined1 local_fd;
  int local_fc;
  undefined8 *local_f0;
  undefined8 *local_d0;
  long local_90;
  undefined4 local_84;
  long local_80;
  undefined4 *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  void *local_40;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  local_1dc = in_R8D * in_R9D;
  local_1d0 = in_ECX;
  local_1cc = in_EDX;
  local_1c8 = in_RSI;
  Mat::reshape(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffdac,
               (Allocator *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  Mat::create(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
              (int)in_stack_fffffffffffffcd8,_c,in_stack_fffffffffffffcc8,
              (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
              (Allocator *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  for (local_238 = 0; local_238 + in_stack_00000010 + -1 < local_1d0;
      local_238 = in_stack_00000010 + local_238) {
    local_fc = local_238 / in_stack_00000010;
    local_f0 = &local_288;
    local_64 = *(int *)((long)local_1c8 + 0x2c);
    local_68 = (int)local_1c8[6];
    local_6c = *(undefined4 *)((long)local_1c8 + 0x34);
    local_78 = (undefined4 *)(*local_1c8 + local_1c8[8] * (long)local_fc * local_1c8[2]);
    local_80 = local_1c8[2];
    local_84 = (undefined4)local_1c8[3];
    local_90 = local_1c8[4];
    local_60 = &local_288;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_d0 = &local_288;
    local_1b8 = &local_288;
    local_c = 0x10;
    local_fd = 1;
    local_288 = 0;
    local_278 = 0;
    local_270 = 0;
    local_280 = 0;
    local_240 = local_78;
    for (local_28c = 0; local_28c + in_stack_00000008 + -1 < local_1cc;
        local_28c = in_stack_00000008 + local_28c) {
      for (local_290 = 0; local_290 < local_1dc; local_290 = local_290 + 1) {
        for (local_294 = 0; local_294 < in_stack_00000008; local_294 = local_294 + 1) {
          for (local_298 = 0; local_298 < in_stack_00000010; local_298 = local_298 + 1) {
            local_12c = local_238 + local_298;
            local_120 = &local_2e8;
            local_128 = &local_228;
            local_40 = (void *)((long)local_228 + local_1e8 * local_12c * local_218);
            local_28 = &local_2e8;
            local_18 = (long)local_1fc * (long)local_1f8 * local_218;
            local_13c = local_28c + local_294;
            local_138 = &local_2e8;
            local_1a8 = &local_2e8;
            local_1c = 0x10;
            local_12d = 1;
            local_2e8 = 0;
            local_2e0 = 0;
            *local_240 = *(undefined4 *)
                          ((long)local_40 +
                          (long)local_290 * 4 + (long)local_1fc * (long)local_13c * local_218);
            local_240 = local_240 + 1;
            local_168 = local_1a8;
          }
        }
      }
    }
    local_148 = local_1b8;
    local_268 = local_90;
  }
  local_1a0 = &local_228;
  if (local_220 != (int *)0x0) {
    local_17c = 0xffffffff;
    LOCK();
    local_180 = *local_220;
    *local_220 = *local_220 + -1;
    UNLOCK();
    if (local_180 == 1) {
      local_178 = local_1a0;
      if (local_208 == (long *)0x0) {
        if (local_228 != (void *)0x0) {
          free(local_228);
        }
      }
      else {
        (**(code **)(*local_208 + 0x18))(local_208,local_228);
      }
    }
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, int kernel_w, int kernel_h, int elempack, int out_elempack)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }
}